

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ExprList *pEVar4;
  SrcList *pSVar5;
  Table *pTab;
  Vdbe *pVVar6;
  Schema *pSVar7;
  undefined1 auVar8 [16];
  u8 uVar9;
  char cVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  int addr;
  Select *pSVar14;
  KeyInfo *zP4;
  CollSeq *pCVar15;
  Expr *pEVar16;
  Expr *pEVar17;
  int iVar18;
  char *pcVar19;
  Op *pOVar20;
  long lVar21;
  Schema **ppSVar22;
  ulong uVar23;
  uint uVar24;
  ExprList_item *pEVar25;
  SrcList **ppSVar26;
  Index *pIdx;
  int iVar27;
  int iVar28;
  Op *pOVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  SelectDest dest;
  char local_b1;
  Expr *local_b0;
  ExprList_item *local_a8;
  ulong local_a0;
  int local_94;
  KeyInfo *local_90;
  Vdbe *local_88;
  ulong local_80;
  Expr *local_78;
  int *local_70;
  int *local_68;
  undefined1 local_60 [16];
  _func_int_Walker_ptr_Select_ptr *p_Stack_50;
  u8 local_3c;
  anon_union_8_14_c5524298_for_u local_38;
  
  local_a0 = (ulong)(uint)pParse->nTab;
  pParse->nTab = pParse->nTab + 1;
  local_70 = aiMap;
  local_88 = sqlite3GetVdbe(pParse);
  local_68 = piTab;
  if (prRhsHasNull == (int *)0x0) {
    prRhsHasNull = (int *)0x0;
  }
  else if ((pX->flags & 0x800) != 0) {
    pEVar4 = ((pX->x).pSelect)->pEList;
    uVar24 = pEVar4->nExpr;
    if ((int)uVar24 < 1) {
      uVar32 = 0;
    }
    else {
      pEVar25 = pEVar4->a;
      uVar32 = 0;
      do {
        iVar12 = sqlite3ExprCanBeNull(pEVar25->pExpr);
        if (iVar12 != 0) goto LAB_0019800d;
        uVar32 = uVar32 + 1;
        pEVar25 = pEVar25 + 1;
      } while (uVar24 != uVar32);
      uVar32 = (ulong)uVar24;
    }
LAB_0019800d:
    if ((uint)uVar32 == uVar24) {
      prRhsHasNull = (int *)0x0;
    }
  }
  local_b0 = pX;
  if ((((((pParse->nErr == 0) && ((pX->flags & 0x820) == 0x800)) &&
        (pSVar14 = (pX->x).pSelect, pSVar14->pPrior == (Select *)0x0)) &&
       (((pSVar14->selFlags & 9) == 0 && (pSVar14->pLimit == (Expr *)0x0)))) &&
      ((pSVar14->pWhere == (Expr *)0x0 &&
       ((pSVar5 = pSVar14->pSrc, pSVar5->nSrc == 1 && (pSVar5->a[0].pSelect == (Select *)0x0))))))
     && (pTab = pSVar5->a[0].pTab, pTab->nModuleArg == 0)) {
    uVar24 = pSVar14->pEList->nExpr;
    uVar32 = (ulong)uVar24;
    pEVar25 = pSVar14->pEList->a;
    if (0 < (int)uVar24) {
      lVar21 = 0;
      do {
        if (**(char **)((long)&pEVar25->pExpr + lVar21) != -0x5e) goto LAB_00198075;
        lVar21 = lVar21 + 0x20;
      } while (uVar32 << 5 != lVar21);
    }
    if (pTab->pSchema == (Schema *)0x0) {
      iVar12 = -0x4240;
    }
    else {
      iVar12 = -0x10000;
      ppSVar22 = &pParse->db->aDb->pSchema;
      do {
        iVar12 = iVar12 + 0x10000;
        pSVar7 = *ppSVar22;
        ppSVar22 = ppSVar22 + 4;
      } while (pSVar7 != pTab->pSchema);
      iVar12 = iVar12 >> 0x10;
    }
    local_a8 = pEVar25;
    sqlite3CodeVerifySchema(pParse,iVar12);
    local_94 = iVar12;
    sqlite3TableLock(pParse,iVar12,pTab->tnum,'\0',pTab->zName);
    pVVar6 = local_88;
    if (uVar24 != 1) {
      if (0 < (int)uVar24) goto LAB_00198935;
LAB_0019899d:
      pIdx = pTab->pIndex;
      if (pIdx != (Index *)0x0) {
        local_90 = (KeyInfo *)(-1L << ((byte)uVar24 & 0x3f));
        do {
          uVar3 = pIdx->nColumn;
          if (((((int)uVar24 <= (int)(uint)uVar3) && (uVar3 < 0x3f)) &&
              (pIdx->pPartIdxWhere == (Expr *)0x0)) &&
             (((inFlags & 4) == 0 ||
              (((int)(uint)pIdx->nKeyCol <= (int)uVar24 &&
               ((uVar3 <= uVar24 || (pIdx->onError != '\0')))))))) {
            if (0 < (int)uVar24) {
              uVar31 = 0;
              uVar30 = 0;
              do {
                local_80 = uVar30;
                pEVar16 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar31);
                pEVar17 = local_a8[uVar31].pExpr;
                pCVar15 = sqlite3BinaryCompareCollSeq(pParse,pEVar16,pEVar17);
                uVar23 = 0;
LAB_00198a44:
                pX = local_b0;
                uVar30 = local_80;
                if (pIdx->aiColumn[uVar23] != pEVar17->iColumn) goto LAB_00198a83;
                if (pCVar15 != (CollSeq *)0x0) {
                  lVar21 = 0;
                  do {
                    bVar2 = pCVar15->zName[lVar21];
                    if (bVar2 == pIdx->azColl[uVar23][lVar21]) {
                      if ((ulong)bVar2 == 0) break;
                    }
                    else if (""[bVar2] != ""[(byte)pIdx->azColl[uVar23][lVar21]]) goto LAB_00198a83;
                    lVar21 = lVar21 + 1;
                  } while( true );
                }
                if ((uVar24 == (uint)uVar23) || ((local_80 >> (uVar23 & 0x3f) & 1) != 0))
                goto LAB_00198af1;
                if (local_70 != (int *)0x0) {
                  local_70[uVar31] = (uint)uVar23;
                }
                uVar30 = local_80 | 1L << ((byte)uVar23 & 0x3f);
                uVar31 = uVar31 + 1;
                if (uVar31 == uVar32) goto LAB_00198af1;
              } while( true );
            }
            uVar30 = 0;
LAB_00198af1:
            pVVar6 = local_88;
            if ((uVar30 ^ (ulong)local_90) == 0xffffffffffffffff) {
              iVar12 = sqlite3VdbeAddOp3(local_88,0x11,0,0,0);
              sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
              sqlite3VdbeAddOp3(pVVar6,0x6c,(int)local_a0,pIdx->tnum,local_94);
              sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
              bVar2 = *pIdx->aSortOrder;
              if (prRhsHasNull != (int *)0x0) {
                iVar18 = pParse->nMem + 1;
                pParse->nMem = iVar18;
                *prRhsHasNull = iVar18;
                if (uVar24 == 1) {
                  sqlite3SetHasNullFlag(local_88,(int)local_a0,iVar18);
                }
              }
              if (local_88->db->mallocFailed == '\0') {
                iVar18 = local_88->nOp + -1;
                if (-1 < iVar12) {
                  iVar18 = iVar12;
                }
                pOVar20 = local_88->aOp + iVar18;
              }
              else {
                pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              iVar12 = bVar2 + 3;
              pOVar20->p2 = local_88->nOp;
              pX = local_b0;
              goto LAB_001986d9;
            }
          }
          pIdx = pIdx->pNext;
        } while (pIdx != (Index *)0x0);
      }
      goto LAB_00198075;
    }
    if (-1 < local_a8->pExpr->iColumn) {
LAB_00198935:
      uVar30 = 0;
      pEVar25 = local_a8;
      do {
        pEVar17 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar30);
        lVar21 = (long)pEVar25->pExpr->iColumn;
        if (lVar21 < 0) {
          cVar10 = 'D';
        }
        else {
          cVar10 = pTab->aCol[lVar21].affinity;
        }
        cVar11 = sqlite3CompareAffinity(pEVar17,cVar10);
        bVar33 = (byte)(cVar11 + 0xbfU) < 2;
        uVar30 = uVar30 + 1;
        pX = local_b0;
      } while ((uVar30 < uVar32) && (pEVar25 = pEVar25 + 1, 'B' < cVar10 || bVar33));
      if ('B' >= cVar10 && !bVar33) goto LAB_00198075;
      goto LAB_0019899d;
    }
    iVar18 = sqlite3VdbeAddOp3(local_88,0x11,0,0,0);
    sqlite3OpenTable(pParse,(int)local_a0,local_94,pTab,0x6c);
    sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName);
    iVar12 = pVVar6->nOp;
    if (pVVar6->db->mallocFailed == '\0') {
      iVar28 = iVar12 + -1;
      if (-1 < iVar18) {
        iVar28 = iVar18;
      }
      pOVar20 = local_88->aOp + iVar28;
    }
    else {
      pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar20->p2 = iVar12;
    iVar12 = 1;
    pX = local_b0;
  }
  else {
LAB_00198075:
    if (((inFlags & 1) != 0) && ((pX->flags & 0x800) == 0)) {
      pEVar17 = pX->pLeft;
      pX->pLeft = (Expr *)0x0;
      local_3c = '\x01';
      p_Stack_50 = sqlite3SelectWalkFail;
      local_60._8_8_ = exprNodeIsConstant;
      local_38.n = 0;
      walkExpr((Walker *)local_60,pX);
      pX->pLeft = pEVar17;
      iVar12 = 5;
      if ((local_3c == '\0') || (((pX->x).pList)->nExpr < 3)) goto LAB_001986d9;
    }
    local_80 = CONCAT44(local_80._4_4_,pParse->nQueryLoop);
    if ((inFlags & 4) == 0) {
      if (prRhsHasNull == (int *)0x0) goto LAB_0019811c;
      iVar12 = pParse->nMem + 1;
      pParse->nMem = iVar12;
      *prRhsHasNull = iVar12;
    }
    else {
      pParse->nQueryLoop = 0;
LAB_0019811c:
      iVar12 = 0;
    }
    pVVar6 = pParse->pVdbe;
    uVar24 = pX->flags;
    iVar18 = 0;
    if (((uVar24 & 0x20) == 0) && (pParse->iSelfTab == 0)) {
      if ((uVar24 >> 0x19 & 1) == 0) {
        pX->flags = uVar24 | 0x2000000;
        iVar18 = pParse->nMem + 1;
        pParse->nMem = iVar18;
        (pX->y).sub.regReturn = iVar18;
        iVar18 = sqlite3VdbeAddOp3(pVVar6,0x46,0,iVar18,0);
        (pX->y).sub.iAddr = iVar18 + 1;
        iVar18 = sqlite3VdbeAddOp3(pVVar6,0x11,0,0,0);
        goto LAB_00198189;
      }
      iVar18 = sqlite3VdbeAddOp3(pVVar6,0x11,0,0,0);
      if ((pX->flags & 0x800) != 0) {
        sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pX->x).pSelect)->selId);
      }
      sqlite3VdbeAddOp3(pVVar6,0xc,(pX->y).sub.regReturn,(pX->y).sub.iAddr,0);
      sqlite3VdbeAddOp3(pVVar6,0x6f,(int)local_a0,pX->iTable,0);
      if (pVVar6->db->mallocFailed == '\0') {
        iVar28 = pVVar6->nOp + -1;
        if (-1 < iVar18) {
          iVar28 = iVar18;
        }
        pOVar20 = pVVar6->aOp + iVar28;
      }
      else {
        pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar20->p2 = pVVar6->nOp;
      pX = local_b0;
    }
    else {
LAB_00198189:
      pEVar17 = local_b0;
      local_78 = pX->pLeft;
      uVar9 = local_78->op;
      if (uVar9 == 0xa8) {
        uVar9 = local_78->op2;
      }
      if (uVar9 == 0x83) {
        pSVar14 = (local_78->x).pSelect;
LAB_001981b3:
        uVar24 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar14->pEList)->pList->nExpr;
      }
      else {
        uVar24 = 1;
        if (uVar9 == 0xa9) {
          pSVar14 = (Select *)&local_78->x;
          goto LAB_001981b3;
        }
      }
      local_a8 = (ExprList_item *)CONCAT44(local_a8._4_4_,iVar12);
      local_b0->iTable = (int)local_a0;
      local_94 = sqlite3VdbeAddOp3(pVVar6,0x71,(int)local_a0,uVar24,0);
      zP4 = sqlite3KeyInfoAlloc(pParse->db,uVar24,1);
      pSVar14 = (pEVar17->x).pSelect;
      if ((pEVar17->flags & 0x800) == 0) {
        if (pSVar14 == (Select *)0x0) {
          iVar12 = (int)local_a8;
        }
        else {
          cVar10 = sqlite3ExprAffinity(local_78);
          local_b1 = 'A';
          if (cVar10 != '\0') {
            local_b1 = cVar10;
          }
          if (zP4 != (KeyInfo *)0x0) {
            pCVar15 = sqlite3ExprCollSeq(pParse,local_b0->pLeft);
            zP4->aColl[0] = pCVar15;
          }
          uVar9 = pParse->nTempReg;
          if (uVar9 == '\0') {
            iVar12 = pParse->nMem + 1;
            pParse->nMem = iVar12;
LAB_0019839d:
            iVar28 = pParse->nMem + 1;
            pParse->nMem = iVar28;
          }
          else {
            bVar2 = uVar9 - 1;
            pParse->nTempReg = bVar2;
            iVar12 = pParse->aTempReg[bVar2];
            if (bVar2 == 0) goto LAB_0019839d;
            pParse->nTempReg = uVar9 - 2;
            iVar28 = pParse->aTempReg[(byte)(uVar9 - 2)];
          }
          local_90 = zP4;
          if (0 < *(int *)&pSVar14->pEList) {
            ppSVar26 = (SrcList **)&pSVar14->op;
            iVar27 = *(int *)&pSVar14->pEList + 1;
            do {
              pSVar5 = *ppSVar26;
              if (iVar18 == 0) {
LAB_00198421:
                iVar18 = 0;
              }
              else {
                local_3c = '\x01';
                p_Stack_50 = sqlite3SelectWalkFail;
                local_60._8_8_ = exprNodeIsConstant;
                local_38.n = 0;
                if ((pSVar5 != (SrcList *)0x0) &&
                   (walkExpr((Walker *)local_60,(Expr *)pSVar5), local_3c == '\0')) {
                  sqlite3VdbeChangeToNoop(pVVar6,iVar18);
                  pbVar1 = (byte *)((long)&local_b0->flags + 3);
                  *pbVar1 = *pbVar1 & 0xfd;
                  goto LAB_00198421;
                }
              }
              iVar13 = sqlite3ExprCodeTarget(pParse,(Expr *)pSVar5,iVar12);
              addr = sqlite3VdbeAddOp3(pVVar6,0x5c,iVar13,1,iVar28);
              sqlite3VdbeChangeP4(pVVar6,addr,&local_b1,1);
              iVar13 = sqlite3VdbeAddOp3(pVVar6,0x84,(int)local_a0,iVar28,iVar13);
              if (pVVar6->db->mallocFailed == '\0') {
                pOVar20 = pVVar6->aOp;
                pOVar20[iVar13].p4type = -3;
                pOVar20[iVar13].p4.i = 1;
              }
              ppSVar26 = ppSVar26 + 4;
              iVar27 = iVar27 + -1;
            } while (1 < iVar27);
          }
          if (iVar12 != 0) {
            bVar2 = pParse->nTempReg;
            if ((ulong)bVar2 < 8) {
              pParse->nTempReg = bVar2 + 1;
              pParse->aTempReg[bVar2] = iVar12;
            }
          }
          zP4 = local_90;
          iVar12 = (int)local_a8;
          if (iVar28 != 0) {
            bVar2 = pParse->nTempReg;
            if ((ulong)bVar2 < 8) {
              pParse->nTempReg = bVar2 + 1;
              pParse->aTempReg[bVar2] = iVar28;
            }
          }
        }
      }
      else {
        pEVar4 = pSVar14->pEList;
        pcVar19 = "";
        if (iVar18 == 0) {
          pcVar19 = "CORRELATED ";
        }
        local_90 = zP4;
        sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d",pcVar19);
        if (pEVar4->nExpr == uVar24) {
          local_60[0] = '\v';
          local_60._4_4_ = (undefined4)local_a0;
          stack0xffffffffffffffa8 = (undefined1  [16])0x0;
          pcVar19 = exprINAffinity(pParse,local_b0);
          p_Stack_50 = (_func_int_Walker_ptr_Select_ptr *)pcVar19;
          pSVar14->iLimit = 0;
          iVar12 = sqlite3Select(pParse,pSVar14,(SelectDest *)local_60);
          if (iVar12 != 0) {
            if (p_Stack_50 != (_func_int_Walker_ptr_Select_ptr *)0x0) {
              sqlite3DbFreeNN(pParse->db,p_Stack_50);
            }
            pX = local_b0;
            iVar12 = (int)local_a8;
            if ((local_90 != (KeyInfo *)0x0) &&
               (local_90->nRef = local_90->nRef - 1, local_90->nRef == 0)) {
              sqlite3DbFreeNN(local_90->db,local_90);
            }
            goto LAB_001986b0;
          }
          if (p_Stack_50 != (_func_int_Walker_ptr_Select_ptr *)0x0) {
            sqlite3DbFreeNN(pParse->db,p_Stack_50);
          }
          pEVar17 = local_78;
          zP4 = local_90;
          if (0 < (int)uVar24) {
            pEVar25 = pEVar4->a;
            uVar32 = 0;
            do {
              pEVar16 = sqlite3VectorFieldSubexpr(pEVar17,(int)uVar32);
              pCVar15 = sqlite3BinaryCompareCollSeq(pParse,pEVar16,pEVar25->pExpr);
              zP4->aColl[uVar32] = pCVar15;
              uVar32 = uVar32 + 1;
              pEVar25 = pEVar25 + 1;
            } while (uVar24 != uVar32);
          }
          iVar12 = (int)local_a8;
        }
        else {
          zP4 = local_90;
          iVar12 = (int)local_a8;
        }
      }
      pX = local_b0;
      if (zP4 != (KeyInfo *)0x0) {
        sqlite3VdbeChangeP4(pVVar6,local_94,(char *)zP4,-9);
      }
      if (iVar18 != 0) {
        pOVar29 = (Op *)&sqlite3VdbeGetOp_dummy;
        pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (pVVar6->db->mallocFailed == '\0') {
          iVar28 = pVVar6->nOp + -1;
          if (-1 < iVar18) {
            iVar28 = iVar18;
          }
          pOVar20 = pVVar6->aOp + iVar28;
        }
        pOVar20->p2 = pVVar6->nOp;
        sqlite3VdbeAddOp3(pVVar6,0x42,(pX->y).sub.regReturn,0,0);
        iVar18 = pVVar6->nOp + -1;
        if (pVVar6->db->mallocFailed == '\0') {
          iVar28 = (pX->y).sub.iAddr;
          iVar27 = iVar28 + -1;
          if (iVar28 < 1) {
            iVar27 = iVar18;
          }
          pOVar29 = pVVar6->aOp + iVar27;
        }
        pOVar29->p1 = iVar18;
      }
    }
LAB_001986b0:
    if (iVar12 != 0) {
      sqlite3SetHasNullFlag(local_88,(int)local_a0,iVar12);
    }
    pParse->nQueryLoop = (u32)local_80;
    iVar12 = 2;
  }
LAB_001986d9:
  auVar8 = _DAT_001e5070;
  if ((local_70 == (int *)0x0) || (0xfffffffd < iVar12 - 5U)) goto LAB_001987b8;
  pEVar17 = pX->pLeft;
  uVar9 = pEVar17->op;
  if (uVar9 == 0xa8) {
    uVar9 = pEVar17->op2;
  }
  if (uVar9 == 0x83) {
    pSVar14 = (pEVar17->x).pSelect;
LAB_0019871f:
    uVar24 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar14->pEList)->pList->nExpr;
    if ((int)uVar24 < 1) goto LAB_001987b8;
  }
  else {
    uVar24 = 1;
    if (uVar9 == 0xa9) {
      pSVar14 = (Select *)&pEVar17->x;
      goto LAB_0019871f;
    }
  }
  lVar21 = (ulong)uVar24 - 1;
  auVar34._8_4_ = (int)lVar21;
  auVar34._0_8_ = lVar21;
  auVar34._12_4_ = (int)((ulong)lVar21 >> 0x20);
  uVar32 = 0;
  auVar34 = auVar34 ^ _DAT_001e5070;
  auVar35 = _DAT_001e5060;
  do {
    auVar36 = auVar35 ^ auVar8;
    if ((bool)(~(auVar36._4_4_ == auVar34._4_4_ && auVar34._0_4_ < auVar36._0_4_ ||
                auVar34._4_4_ < auVar36._4_4_) & 1)) {
      local_70[uVar32] = (int)uVar32;
    }
    if ((auVar36._12_4_ != auVar34._12_4_ || auVar36._8_4_ <= auVar34._8_4_) &&
        auVar36._12_4_ <= auVar34._12_4_) {
      local_70[uVar32 + 1] = (int)uVar32 + 1;
    }
    uVar32 = uVar32 + 2;
    lVar21 = auVar35._8_8_;
    auVar35._0_8_ = auVar35._0_8_ + 2;
    auVar35._8_8_ = lVar21 + 2;
  } while ((uVar24 + 1 & 0xfffffffe) != uVar32);
LAB_001987b8:
  *local_68 = (int)local_a0;
  return iVar12;
LAB_00198a83:
  uVar23 = uVar23 + 1;
  if (uVar23 == uVar32) goto LAB_00198af1;
  goto LAB_00198a44;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}